

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Totals * __thiscall
Catch::RunContext::runTest(Totals *__return_storage_ptr__,RunContext *this,TestCase *testCase)

{
  size_t *psVar1;
  IStreamingReporter *pIVar2;
  size_t sVar3;
  size_t sVar4;
  bool bVar5;
  bool _aborting;
  int iVar6;
  RunningTest *pRVar7;
  IMutableContext *pIVar8;
  string redirectedCerr;
  string redirectedCout;
  Totals prevTotals;
  TestCaseInfo testInfo;
  TestCaseStats local_180;
  
  prevTotals.assertions.passed = (this->m_totals).assertions.passed;
  prevTotals.assertions.failed = (this->m_totals).assertions.failed;
  prevTotals.testCases.passed = (this->m_totals).testCases.passed;
  prevTotals.testCases.failed = (this->m_totals).testCases.failed;
  redirectedCout._M_dataplus._M_p = (pointer)&redirectedCout.field_2;
  redirectedCout._M_string_length = 0;
  redirectedCout.field_2._M_local_buf[0] = '\0';
  redirectedCerr._M_dataplus._M_p = (pointer)&redirectedCerr.field_2;
  redirectedCerr._M_string_length = 0;
  redirectedCerr.field_2._M_local_buf[0] = '\0';
  TestCaseInfo::TestCaseInfo(&testInfo,&testCase->super_TestCaseInfo);
  pIVar2 = (this->m_reporter).m_p;
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[8])(pIVar2,&testInfo);
  pRVar7 = (RunningTest *)operator_new(0x70);
  RunningTest::RunningTest(pRVar7,testCase);
  this->m_runningTest = pRVar7;
LAB_0014c9ea:
  do {
    runCurrentTest(this,&redirectedCout,&redirectedCerr);
    bVar5 = RunningTest::hasUntestedSections(this->m_runningTest);
    if (bVar5) {
      bVar5 = aborting(this);
      if (!bVar5) goto LAB_0014c9ea;
    }
    pIVar8 = getCurrentMutableContext();
    iVar6 = (*(pIVar8->super_IContext)._vptr_IContext[5])(pIVar8);
    if ((char)iVar6 == '\0') break;
    bVar5 = aborting(this);
  } while (!bVar5);
  Totals::delta(__return_storage_ptr__,&this->m_totals,&prevTotals);
  if ((__return_storage_ptr__->assertions).failed + (__return_storage_ptr__->assertions).passed == 0
     ) {
    iVar6 = (*(((this->m_config).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[9])();
    if ((char)iVar6 != '\0') {
      psVar1 = &(this->m_totals).assertions.failed;
      *psVar1 = *psVar1 + 1;
      Totals::delta((Totals *)&local_180,&this->m_totals,&prevTotals);
      (__return_storage_ptr__->testCases).passed = local_180.testInfo.name._M_string_length;
      (__return_storage_ptr__->testCases).failed =
           local_180.testInfo.name.field_2._M_allocated_capacity;
      (__return_storage_ptr__->assertions).passed = (size_t)local_180._vptr_TestCaseStats;
      (__return_storage_ptr__->assertions).failed = (size_t)local_180.testInfo.name._M_dataplus._M_p
      ;
      bVar5 = true;
      goto LAB_0014ca97;
    }
  }
  bVar5 = false;
LAB_0014ca97:
  sVar3 = (__return_storage_ptr__->testCases).failed;
  sVar4 = (this->m_totals).testCases.failed;
  (this->m_totals).testCases.passed =
       (this->m_totals).testCases.passed + (__return_storage_ptr__->testCases).passed;
  (this->m_totals).testCases.failed = sVar4 + sVar3;
  pIVar2 = (this->m_reporter).m_p;
  _aborting = aborting(this);
  TestCaseStats::TestCaseStats
            (&local_180,&testInfo,__return_storage_ptr__,&redirectedCout,&redirectedCerr,bVar5,
             _aborting);
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar2,&local_180);
  TestCaseStats::~TestCaseStats(&local_180);
  pRVar7 = this->m_runningTest;
  if (pRVar7 != (RunningTest *)0x0) {
    RunningSection::~RunningSection(&pRVar7->m_rootSection);
  }
  operator_delete(pRVar7);
  this->m_runningTest = (RunningTest *)0x0;
  TestCaseInfo::~TestCaseInfo(&testInfo);
  std::__cxx11::string::~string((string *)&redirectedCerr);
  std::__cxx11::string::~string((string *)&redirectedCout);
  return __return_storage_ptr__;
}

Assistant:

Totals runTest( TestCase const& testCase ) {
            Totals prevTotals = m_totals;

            std::string redirectedCout;
            std::string redirectedCerr;

            TestCaseInfo testInfo = testCase.getTestCaseInfo();

            m_reporter->testCaseStarting( testInfo );

            m_runningTest = new RunningTest( testCase );

            do {
                do {
                    runCurrentTest( redirectedCout, redirectedCerr );
                }
                while( m_runningTest->hasUntestedSections() && !aborting() );
            }
            while( getCurrentContext().advanceGeneratorsForCurrentTest() && !aborting() );

            Totals deltaTotals = m_totals.delta( prevTotals );
            bool missingAssertions = false;
            if( deltaTotals.assertions.total() == 0  && m_config->warnAboutMissingAssertions() ) {
                m_totals.assertions.failed++;
                deltaTotals = m_totals.delta( prevTotals );
                missingAssertions = true;
            }

            m_totals.testCases += deltaTotals.testCases;

            m_reporter->testCaseEnded( TestCaseStats(   testInfo,
                                                        deltaTotals,
                                                        redirectedCout,
                                                        redirectedCerr,
                                                        missingAssertions,
                                                        aborting() ) );

            delete m_runningTest;
            m_runningTest = NULL;

            return deltaTotals;
        }